

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O1

uint __thiscall llvm::ARM::getDefaultExtensions(ARM *this,StringRef CPU,ArchKind AK)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  
  pcVar3 = CPU.Data;
  if (pcVar3 == (char *)0x4) {
    bVar4 = *(int *)this == 0x326d7261;
  }
  else {
    if ((pcVar3 == (char *)0x7) && (*(int *)(this + 3) == 0x63697265 && *(int *)this == 0x656e6567))
    {
      return *(uint *)(&DAT_001e88a4 + (CPU.Length & 0xffffffff) * 0x40);
    }
    bVar4 = false;
  }
  if ((pcVar3 == (char *)0x4) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)this != 0x336d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x4) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)this != 0x366d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x5) && (!bVar4)) {
    bVar4 = true;
    if (this[4] != (ARM)0x6d || *(int *)this != 0x376d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x4) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)this != 0x386d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x6) && (!bVar4)) {
    bVar4 = true;
    if (*(short *)(this + 4) != 0x3031 || *(int *)this != 0x386d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x9) && (!bVar4)) {
    bVar4 = true;
    if (this[8] != (ARM)0x6d || *(long *)this != 0x7261676e6f727473) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0xc) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)(this + 8) != 0x3031316d || *(long *)this != 0x7261676e6f727473) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0xd) && (!bVar4)) {
    bVar4 = true;
    if (*(long *)(this + 5) != 0x303031316d726167 || *(long *)this != 0x7261676e6f727473) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0xd) && (!bVar4)) {
    bVar4 = true;
    if (*(long *)(this + 5) != 0x303131316d726167 || *(long *)this != 0x7261676e6f727473) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x8) && (!bVar4)) {
    bVar4 = true;
    if (*(long *)this != 0x696d6474376d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0xa) && (!bVar4)) {
    bVar4 = true;
    if (*(short *)(this + 8) != 0x732d || *(long *)this != 0x696d6474376d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x7) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)(this + 3) != 0x74303137 || *(int *)this != 0x376d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x7) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)(this + 3) != 0x74303237 || *(int *)this != 0x376d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x4) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)this != 0x396d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x8) && (!bVar4)) {
    bVar4 = true;
    if (*(long *)this != 0x696d6474396d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x6) && (!bVar4)) {
    bVar4 = true;
    if (*(short *)(this + 4) != 0x3032 || *(int *)this != 0x396d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x7) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)(this + 3) != 0x74303239 || *(int *)this != 0x396d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x7) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)(this + 3) != 0x74323239 || *(int *)this != 0x396d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x7) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)(this + 3) != 0x32313339 || *(int *)this != 0x396d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x7) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)(this + 3) != 0x74303439 || *(int *)this != 0x396d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x6) && (!bVar4)) {
    bVar4 = true;
    if (*(short *)(this + 4) != 0x3231 || *(int *)this != 0x33397065) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x9) && (!bVar4)) {
    bVar4 = true;
    if (this[8] != (ARM)0x69 || *(long *)this != 0x6d647430316d7261) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x8) && (!bVar4)) {
    bVar4 = true;
    if (*(long *)this != 0x74303230316d7261) {
      bVar4 = false;
    }
  }
  uVar2 = 1;
  if (!bVar4) {
    if (pcVar3 == (char *)0x5) {
      bVar5 = this[4] == (ARM)0x65 && *(int *)this == 0x396d7261;
    }
    else {
      bVar5 = false;
    }
    uVar2 = (uint)bVar5 * 0x400 + 1;
    bVar4 = true;
    if (bVar5 == false) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x73 && *(long *)this == 0x2d653634396d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x73 && *(long *)this == 0x2d653636396d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x73 && *(long *)this == 0x2d653836396d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x6) {
      bVar5 = *(short *)(this + 4) == 0x6530 && *(int *)this == 0x316d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x8) {
      bVar5 = *(long *)this == 0x65303230316d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x8) {
      bVar5 = *(long *)this == 0x65323230316d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x732d && *(long *)this == 0x6a653632396d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x732d && *(long *)this == 0x6a363331316d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xb) {
      bVar5 = *(long *)(this + 3) == 0x732d666a36333131 && *(long *)this == 0x6a363331316d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xb) {
      bVar5 = *(long *)(this + 3) == 0x732d7a6a36333131 && *(long *)this == 0x6a363331316d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x732d && *(long *)this == 0x6a363731316d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xb) {
      bVar5 = *(long *)(this + 3) == 0x732d7a6a36373131 && *(long *)this == 0x6a363731316d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x501;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x6) {
      bVar5 = *(short *)(this + 4) == 0x6572 && *(int *)this == 0x6f63706d;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xb) {
      bVar5 = *(long *)(this + 3) == 0x7066766f6e65726f && *(long *)this == 0x6f6e65726f63706d;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xc) {
      bVar5 = *(int *)(this + 8) == 0x732d667a && *(long *)this == 0x6a363731316d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x501;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xb) {
      bVar5 = *(long *)(this + 3) == 0x732d327436353131 && *(long *)this == 0x74363531316d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xc) {
      bVar5 = *(int *)(this + 8) == 0x732d6632 && *(long *)this == 0x74363531316d7261;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x401;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x30 && *(long *)this == 0x6d2d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 1;
    }
    bVar4 = false;
    if (bVar5) {
      bVar4 = true;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xd) {
      bVar5 = *(long *)(this + 5) == 0x73756c70306d2d78 && *(long *)this == 0x6d2d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 1;
    }
    bVar4 = false;
    if (bVar5) {
      bVar4 = true;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x31 && *(long *)this == 0x6d2d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 1;
    }
    bVar4 = false;
    if (bVar5) {
      bVar4 = true;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x5) {
      bVar5 = this[4] == (ARM)0x30 && *(int *)this == 0x30306373;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 1;
    }
    bVar4 = false;
    if (bVar5) {
      bVar4 = true;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x35 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x540;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x37 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x770;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x38 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x500;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x39 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x540;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3231 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x770;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3531 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x770;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3731 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x770;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x5) {
      bVar5 = this[4] == (ARM)0x74 && *(int *)this == 0x6961726b;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x430;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x34 && *(long *)this == 0x722d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x411;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x6634 && *(long *)this == 0x722d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x411;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x35 && *(long *)this == 0x722d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x470;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x37 && *(long *)this == 0x722d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x470;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x38 && *(long *)this == 0x722d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x470;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3235 && *(long *)this == 0x722d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x673;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x5) {
      bVar5 = this[4] == (ARM)0x30 && *(int *)this == 0x30336373;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x11;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x33 && *(long *)this == 0x6d2d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x11;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x34 && *(long *)this == 0x6d2d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x411;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x37 && *(long *)this == 0x6d2d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x411;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3332 && *(long *)this == 0x6d2d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x11;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3333 && *(long *)this == 0x6d2d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x410;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3233 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x772;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3533 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x772;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3335 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x772;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3535 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x5f72;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3735 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x772;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3237 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x772;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3337 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x772;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3537 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x5f72;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x7) {
      bVar5 = *(int *)(this + 3) == 0x656e6f6c && *(int *)this == 0x6c637963;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x772;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x31 && *(long *)this == 0x6d2d736f6e797865;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x772;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x32 && *(long *)this == 0x6d2d736f6e797865;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x772;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x33 && *(long *)this == 0x6d2d736f6e797865;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x772;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (ARM)0x34 && *(long *)this == 0x6d2d736f6e797865;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x772;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x4) {
      bVar5 = *(int *)this == 0x6f79726b;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x772;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x6) {
      bVar5 = *(short *)(this + 4) == 0x7478 && *(int *)this == 0x6d6d7769;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 1;
    }
    bVar4 = false;
    if (bVar5) {
      bVar4 = true;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x6) {
      bVar5 = *(short *)(this + 4) == 0x656c && *(int *)this == 0x61637378;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 1;
    }
    bVar4 = false;
    if (bVar5) {
      bVar4 = true;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x5) {
      bVar5 = this[4] == (ARM)0x74 && *(int *)this == 0x66697773;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x430;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x7) {
      bVar5 = *(int *)(this + 3) == 0x64696c61 && *(int *)this == 0x61766e69;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 1;
    }
    bVar4 = false;
    if (bVar5) {
      bVar4 = true;
    }
  }
  uVar1 = 0;
  if (bVar4) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

bool equals(StringRef RHS) const {
      return (Length == RHS.Length &&
              compareMemory(Data, RHS.Data, RHS.Length) == 0);
    }